

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_ref_pic_list_modification
              (bitstream *str,h264_slice *slice,h264_ref_pic_list_modification *list)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint32_t *in_RDX;
  bitstream *in_RSI;
  int i;
  uint32_t in_stack_ffffffffffffffdc;
  int local_4;
  
  iVar1 = vs_u(in_RSI,in_RDX,in_stack_ffffffffffffffdc);
  if (iVar1 == 0) {
    if (*in_RDX == 0) {
      iVar1 = vs_infer(in_RSI,in_RDX,in_stack_ffffffffffffffdc);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = 0;
      do {
        iVar2 = vs_ue(in_RSI,in_RDX);
        if (iVar2 != 0) {
          return 1;
        }
        if (in_RDX[(long)iVar1 * 3 + 1] != 3) {
          iVar2 = vs_ue(in_RSI,in_RDX);
          if (iVar2 != 0) {
            return 1;
          }
          if (iVar1 == 0x20) {
            fprintf(_stderr,"Too many ref_pic_list_modification entries\n");
            return 1;
          }
        }
        lVar3 = (long)iVar1;
        iVar1 = iVar1 + 1;
      } while (in_RDX[lVar3 * 3 + 1] != 3);
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h264_ref_pic_list_modification(struct bitstream *str, struct h264_slice *slice, struct h264_ref_pic_list_modification *list) {
	int i;
	if (vs_u(str, &list->flag, 1)) return 1;
	if (list->flag) {
		i = 0;
		do {
			if (vs_ue(str, &list->list[i].op)) return 1;
			if (list->list[i].op != 3) {
				if (vs_ue(str, &list->list[i].param)) return 1;
				if (i == 32) {
					fprintf(stderr, "Too many ref_pic_list_modification entries\n");
					return 1;
				}
			}
		} while (list->list[i++].op != 3);
	} else {
		if (vs_infer(str, &list->list[0].op, 3)) return 1;
	}
	return 0;
}